

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl3.h
# Opt level: O2

nk_context * nk_glfw3_init(nk_glfw *glfw,GLFWwindow *win,nk_glfw_init_state init_state)

{
  glfwSetWindowUserPointer(win,glfw);
  glfw->win = win;
  if (init_state == NK_GLFW3_INSTALL_CALLBACKS) {
    glfwSetScrollCallback(win,nk_gflw3_scroll_callback);
    glfwSetCharCallback(win,nk_glfw3_char_callback);
    glfwSetMouseButtonCallback(win,nk_glfw3_mouse_button_callback);
  }
  nk_init_default(&glfw->ctx,(nk_user_font *)0x0);
  (glfw->ctx).clip.copy = nk_glfw3_clipboard_copy;
  (glfw->ctx).clip.paste = nk_glfw3_clipboard_paste;
  (glfw->ctx).clip.userdata.ptr = (void *)0x0;
  glfw->last_button_click = 0.0;
  nk_glfw3_device_create(glfw);
  glfw->is_double_click_down = 0;
  (glfw->double_click_pos).x = 0.0;
  (glfw->double_click_pos).y = 0.0;
  return &glfw->ctx;
}

Assistant:

NK_API struct nk_context*
nk_glfw3_init(struct nk_glfw* glfw, GLFWwindow *win, enum nk_glfw_init_state init_state)
{
    glfwSetWindowUserPointer(win, glfw);
    glfw->win = win;
    if (init_state == NK_GLFW3_INSTALL_CALLBACKS) {
        glfwSetScrollCallback(win, nk_gflw3_scroll_callback);
        glfwSetCharCallback(win, nk_glfw3_char_callback);
        glfwSetMouseButtonCallback(win, nk_glfw3_mouse_button_callback);
    }
    nk_init_default(&glfw->ctx, 0);
    glfw->ctx.clip.copy = nk_glfw3_clipboard_copy;
    glfw->ctx.clip.paste = nk_glfw3_clipboard_paste;
    glfw->ctx.clip.userdata = nk_handle_ptr(0);
    glfw->last_button_click = 0;
    nk_glfw3_device_create(glfw);

    glfw->is_double_click_down = nk_false;
    glfw->double_click_pos = nk_vec2(0, 0);

    return &glfw->ctx;
}